

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O2

int verify_opts(nt_opts *opts,char *prog)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  size_t sStack_20;
  
  uVar1 = 1;
  uVar3 = 1;
  uVar4 = uVar3;
  if (opts->check_hdr == 0) {
    uVar4 = (uint)(opts->check_nim != 0);
  }
  uVar8 = uVar3;
  if (opts->diff_hdr == 0) {
    uVar8 = (uint)(opts->diff_nim != 0);
  }
  uVar5 = uVar3;
  if (((opts->disp_hdr == 0) && (opts->disp_nim == 0)) && (opts->disp_ana == 0)) {
    uVar5 = (uint)(opts->disp_exts != 0);
  }
  iVar2 = opts->mod_hdr;
  uVar6 = uVar3;
  if (iVar2 == 0) {
    uVar6 = (uint)(opts->mod_nim != 0);
  }
  uVar10 = uVar3;
  if ((opts->swap_hdr == 0) && (opts->swap_ana == 0)) {
    uVar10 = (uint)(opts->swap_old != 0);
  }
  if (opts->add_exts == 0) {
    uVar3 = (uint)(opts->rm_exts != 0);
  }
  if (opts->dts == 0) {
    uVar1 = (uint)(opts->dci != 0);
  }
  iVar9 = (((((uVar8 + uVar4 + uVar5 + uVar6 + uVar10 + uVar3) - (uint)(opts->strip == 0)) -
            (uint)(opts->cbl == 0)) + 3) - (uint)(opts->cci == 0)) + uVar1;
  if (iVar9 != 1) {
    if (iVar9 == 0) {
      pcVar7 = 
      "** no action option, so nothing to do...\n   (try one of \'-add...\', \'-diff...\', \'-disp...\' or \'-mod...\')\n   (see \'%s -help\' for details)\n"
      ;
    }
    else {
      pcVar7 = 
      "** only one action option is allowed, please use only one of:\n        \'-add_...\', \'-check_...\', \'-diff_...\', \'-disp_...\',\n        \'-mod_...\', \'-strip\', \'-dts\', \'-cbl\' or \'-cci\'\n   (see \'%s -help\' for details)\n"
      ;
    }
    fprintf(_stderr,pcVar7,prog);
    return 1;
  }
  if ((iVar2 != 0) && (opts->mod_nim != 0)) {
    pcVar7 = "** cannot use both \'-mod_hdr\' and \'-mod_nim\'\n";
    sStack_20 = 0x2d;
    goto LAB_00105ab0;
  }
  if (opts->add_exts == 0) {
    if (opts->rm_exts != 0) goto LAB_001058b4;
  }
  else {
    if (opts->rm_exts != 0) {
      pcVar7 = "** cannot use both \'-add_*_ext\' and \'-rm_ext\'\n";
      sStack_20 = 0x2e;
      goto LAB_00105ab0;
    }
LAB_001058b4:
    if ((opts->elist).len < 1) {
      pcVar7 = "** missing extensions to add or remove\n";
      sStack_20 = 0x27;
      goto LAB_00105ab0;
    }
  }
  if ((iVar2 != 0) || (opts->mod_nim != 0)) {
    iVar9 = (opts->flist).len;
    if (iVar9 < 1) {
      pcVar7 = "** missing field to modify (need \'-mod_field\' opt)\n";
      sStack_20 = 0x33;
      goto LAB_00105ab0;
    }
    if (iVar9 != (opts->vlist).len) {
      fprintf(_stderr,"** error: modifying %d fields with %d values\n");
      return 1;
    }
  }
  if ((opts->diff_hdr == 0) && (opts->diff_nim == 0)) {
    if ((((iVar2 == 0) && ((opts->elist).len < 1)) && (opts->swap_hdr == 0 && opts->mod_nim == 0))
       && ((opts->swap_ana == 0 && (opts->swap_old == 0)))) goto LAB_00105902;
    iVar2 = 0;
    if (opts->overwrite == 0) {
      if ((opts->infiles).len < 2) {
        if (opts->prefix != (char *)0x0) goto LAB_00105904;
        pcVar7 = "** missing -prefix for output file\n";
        sStack_20 = 0x23;
      }
      else {
        pcVar7 = "** without -overwrite, only one input file may be modified at a time\n";
        sStack_20 = 0x45;
      }
      fwrite(pcVar7,sStack_20,1,_stderr);
      iVar2 = 1;
    }
  }
  else {
    if ((opts->infiles).len != 2) {
      pcVar7 = "** \'-diff_XXX\' options require exactly 2 inputs files\n";
      sStack_20 = 0x36;
      goto LAB_00105ab0;
    }
LAB_00105902:
    iVar2 = 0;
  }
LAB_00105904:
  if (((opts->dci_lines != 0) && (opts->dts == 0)) && (opts->dci == 0)) {
    fwrite("** option \'-dci_lines\' must only be used with \'-dts\'\n",0x35,1,_stderr);
    iVar2 = iVar2 + 1;
  }
  if ((opts->infiles).len < 1) {
    fwrite("** missing input files (see -infiles option)\n",0x2d,1,_stderr);
    iVar2 = 1;
  }
  if ((opts->overwrite == 0) || (opts->prefix == (char *)0x0)) {
    if (iVar2 != 0) {
      return 1;
    }
    if (1 < g_debug) {
      fwrite("+d options seem valid\n",0x16,1,_stderr);
      return 0;
    }
    return 0;
  }
  pcVar7 = "** please specify only one of -prefix and -overwrite\n";
  sStack_20 = 0x35;
LAB_00105ab0:
  fwrite(pcVar7,sStack_20,1,_stderr);
  return 1;
}

Assistant:

int verify_opts( nt_opts * opts, char * prog )
{
   int ac, errs = 0;   /* number of requested action types */

   /* check that only one of disp, diff, mod or add_*_ext is used */
   ac  = (opts->check_hdr || opts->check_nim                   ) ? 1 : 0;
   ac += (opts->diff_hdr  || opts->diff_nim                    ) ? 1 : 0;
   ac += (opts->disp_hdr  || opts->disp_nim  ||
          opts->disp_ana  || opts->disp_exts                   ) ? 1 : 0;
   ac += (opts->mod_hdr   || opts->mod_nim                     ) ? 1 : 0;
   ac += (opts->swap_hdr  || opts->swap_ana  || opts->swap_old ) ? 1 : 0;
   ac += (opts->add_exts  || opts->rm_exts                     ) ? 1 : 0;
   ac += (opts->strip                                          ) ? 1 : 0;
   ac += (opts->cbl                                            ) ? 1 : 0;
   ac += (opts->cci                                            ) ? 1 : 0;
   ac += (opts->dts       || opts->dci                         ) ? 1 : 0;

   if( ac < 1 )
   {
      fprintf(stderr,
              "** no action option, so nothing to do...\n"
              "   (try one of '-add...', '-diff...', '-disp...' or '-mod...')\n"
              "   (see '%s -help' for details)\n", prog);
      return 1;
   }
   else if( ac > 1 )
   {
      fprintf(stderr,
         "** only one action option is allowed, please use only one of:\n"
         "        '-add_...', '-check_...', '-diff_...', '-disp_...',\n"
         "        '-mod_...', '-strip', '-dts', '-cbl' or '-cci'\n"
         "   (see '%s -help' for details)\n", prog);
      return 1;
   }

   /* can modify nifti_1_header or nifti_image, but not both */
   if( opts->mod_hdr && opts->mod_nim )
   {
      fprintf(stderr,"** cannot use both '-mod_hdr' and '-mod_nim'\n");
      return 1;
   }

   /* can add or remove extensions, but not both */
   if( opts->add_exts && opts->rm_exts )
   {
      fprintf(stderr,"** cannot use both '-add_*_ext' and '-rm_ext'\n");
      return 1;
   }
   if( (opts->add_exts || opts->rm_exts) && opts->elist.len <= 0 )
   {
      fprintf(stderr,"** missing extensions to add or remove\n");
      return 1;
   }

   /* if modify, then we need fields and corresponding values */
   if( opts->mod_hdr || opts->mod_nim )
   {
      if( opts->flist.len <= 0 )
      {
         fprintf(stderr,"** missing field to modify (need '-mod_field' opt)\n");
         return 1;
      }
      if( opts->flist.len != opts->vlist.len )
      {
         fprintf(stderr,"** error: modifying %d fields with %d values\n",
                 opts->flist.len, opts->vlist.len);
         return 1;
      }
   }

   /* verify the number of files given for each of 4 action types */

   /* -diff_... : require nfiles == 2 */
   if( opts->diff_hdr || opts->diff_nim )
   {
     if( opts->infiles.len != 2 )
     {
      fprintf(stderr,"** '-diff_XXX' options require exactly 2 inputs files\n");
      return 1;
     }
   }
   /* if we are making changes, but not overwriting... */
   else if( (opts->elist.len > 0 || opts->mod_hdr || opts->mod_nim ||
             opts->swap_hdr || opts->swap_ana || opts->swap_old ) &&
            !opts->overwrite )
   {
      if( opts->infiles.len > 1 )
      {
         fprintf(stderr,"** without -overwrite, only one input file may be"
                          " modified at a time\n");
         errs++;
      }
      else if( ! opts->prefix )
      {
         fprintf(stderr,"** missing -prefix for output file\n");
         errs++;
      }
   }

   if( opts->dci_lines && ! opts->dts && ! opts->dci )
   {
      fprintf(stderr,"** option '-dci_lines' must only be used with '-dts'\n");
      errs++;
   }

   if( opts->infiles.len <= 0 ) /* in any case */
   {
      fprintf(stderr,"** missing input files (see -infiles option)\n");
      errs++;
   }

   if ( opts->overwrite && opts->prefix )
   {
      fprintf(stderr, "** please specify only one of -prefix and -overwrite\n");
      errs++;
   }

   if( errs ) return 1;

   if( g_debug > 1 ) fprintf(stderr,"+d options seem valid\n");

   return 0;
}